

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_set.c
# Opt level: O2

int set_bucket_realloc_iterator(set s,set_key key,set_value value,set_cb_iterate_args args)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  
  iVar3 = 1;
  if (((args != (set_cb_iterate_args)0x0) && (key != (set_key)0x0)) && ((set)args != s)) {
    uVar2 = (**(code **)((long)args + 0x20))(key);
    iVar1 = bucket_insert((bucket)((uVar2 % *(ulong *)((long)args + 8)) * 0x18 +
                                  *(long *)((long)args + 0x18)),key,value);
    if (iVar1 == 0) {
      *(long *)args = *args + 1;
      iVar3 = 0;
    }
    else {
      log_write_impl_va("metacall",0x81,"set_bucket_realloc_iterator",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_set.c"
                        ,3,"Invalid set bucket realloc insertion");
    }
  }
  return iVar3;
}

Assistant:

static int set_bucket_realloc_iterator(set s, set_key key, set_value value, set_cb_iterate_args args)
{
	set new_set = (set)args;

	if (new_set != s && key != NULL && args != NULL)
	{
		set_hash h = new_set->hash_cb(key);

		size_t index = h % new_set->capacity;

		bucket b = &new_set->buckets[index];

		if (bucket_insert(b, key, value) != 0)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Invalid set bucket realloc insertion");
			return 1;
		}

		++new_set->count;

		return 0;
	}

	return 1;
}